

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O2

double __thiscall ON_SubDMatrix::TestMatrix(ON_SubDMatrix *this)

{
  double *E2;
  double *LP;
  double *L1;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint i;
  uint uVar4;
  uint uVar5;
  double *E1;
  ulong uVar6;
  ulong uVar7;
  uint j;
  double *pdVar8;
  ulong uVar9;
  double *L2;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double rc;
  double dVar15;
  double dVar16;
  ON_SimpleArray<double> buffer;
  double local_e8;
  double dStack_e0;
  double local_98;
  double dStack_90;
  double local_88;
  double local_68;
  double local_58;
  ON_SimpleArray<double> local_48;
  
  if ((((this->m_S == (double **)0x0) || (this->m_R < 3)) ||
      (bVar1 = ON_SubDSectorType::IsValid(&this->m_sector_type), !bVar1)) ||
     (((uVar5 = this->m_R, uVar4 = ON_SubDSectorType::PointRingCount(&this->m_sector_type),
       uVar5 != uVar4 ||
       (dVar11 = ON_SubDSectorType::SubdominantEigenvalue(&this->m_sector_type), dVar11 <= 0.0)) ||
      ((1.0 <= dVar11 ||
       (uVar5 = ON_SubDSectorType::SubdominantEigenvalueMulitiplicity(&this->m_sector_type),
       uVar5 == 0)))))) {
    ON_SubDIncrementErrorCount();
    return -1.23432101234321e+308;
  }
  bVar1 = ON_SubDSectorType::IsValid(&this->m_sector_type);
  local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c348;
  local_48.m_a = (double *)0x0;
  local_48.m_count = 0;
  local_48.m_capacity = 0;
  E1 = ON_SimpleArray<double>::Reserve(&local_48,(ulong)(this->m_R * 5));
  uVar9 = (ulong)this->m_R;
  E2 = E1 + uVar9;
  dVar12 = ON_SubDSectorType::GetSubdominantEigenvectors(&this->m_sector_type,E1,uVar9,E2,uVar9);
  if ((dVar12 != dVar11) || (NAN(dVar12) || NAN(dVar11))) {
LAB_006222ac:
    ON_SubDIncrementErrorCount();
  }
  else {
    LP = E2 + uVar9;
    L1 = LP + uVar9;
    L2 = L1 + uVar9;
    uVar6 = (ulong)this->m_R;
    if (bVar1) {
      uVar4 = ON_SubDSectorType::GetSurfaceEvaluationCoefficients
                        (&this->m_sector_type,LP,uVar6,L1,uVar6,L2,uVar6);
      if (uVar4 == 0) goto LAB_006222ac;
    }
    else {
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        LP[uVar7] = 0.0;
        L1[uVar7] = 0.0;
        L2[uVar7] = 0.0;
      }
    }
    bVar2 = ON_SubDSectorType::IsSmoothSector(&this->m_sector_type);
    if (((bVar2) || (bVar2 = ON_SubDSectorType::IsDartSector(&this->m_sector_type), bVar2)) &&
       (uVar4 = ON_SubDSectorType::FaceCount(&this->m_sector_type), uVar4 == 2)) {
      uVar4 = ON_SubDSectorType::EdgeCount(&this->m_sector_type);
      bVar2 = uVar4 == 2;
    }
    else {
      bVar2 = false;
    }
    bVar3 = ON_SubDSectorType::IsSmoothSector(&this->m_sector_type);
    if (((bVar3) || (bVar3 = ON_SubDSectorType::IsDartSector(&this->m_sector_type), bVar3)) &&
       (uVar4 = ON_SubDSectorType::FaceCount(&this->m_sector_type), uVar4 == 2)) {
      uVar4 = ON_SubDSectorType::EdgeCount(&this->m_sector_type);
      bVar3 = uVar4 == 2;
    }
    else {
      bVar3 = false;
    }
    uVar6 = (ulong)this->m_R;
    dVar12 = 0.0;
    dVar14 = 0.0;
    dVar15 = 0.0;
    dVar16 = 0.0;
    pdVar8 = E1;
    while (bVar10 = uVar6 != 0, uVar6 = uVar6 - 1, bVar10) {
      dVar12 = dVar12 + *pdVar8 * *pdVar8;
      dVar14 = dVar14 + pdVar8[uVar9] * pdVar8[uVar9];
      dVar15 = dVar15 + pdVar8[uVar9 * 3] * pdVar8[uVar9 * 3];
      dVar16 = dVar16 + pdVar8[uVar9 * 4] * pdVar8[uVar9 * 4];
      pdVar8 = pdVar8 + 1;
    }
    bVar2 = (bool)(bVar2 | bVar3);
    if ((((bool)(0.0 < dVar12 | bVar2)) && (0.0 < dVar14)) && ((0.0 < dVar15 && (0.0 < dVar16)))) {
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      if (dVar16 < 0.0) {
        dVar16 = sqrt(dVar16);
      }
      else {
        dVar16 = SQRT(dVar16);
      }
      rc = 0.0;
      if (((((bool)(0.0 < dVar12 | bVar2)) && (0.0 < dVar14)) && (0.0 < dVar15)) && (0.0 < dVar16))
      {
        dVar11 = -dVar11;
        local_98 = 0.0;
        dStack_90 = 0.0;
        local_88 = 0.0;
        local_58 = 0.0;
        local_68 = 0.0;
        for (uVar9 = 0; uVar9 < this->m_R; uVar9 = uVar9 + 1) {
          if (LP[uVar9] < 0.0) {
            ON_SubDIncrementErrorCount();
            goto LAB_00622770;
          }
          local_e8 = 0.0;
          dStack_e0 = 0.0;
          for (uVar6 = 0; this->m_R != uVar6; uVar6 = uVar6 + 1) {
            local_e8 = local_e8 + E1[uVar6] * this->m_S[uVar9][uVar6];
            dStack_e0 = dStack_e0 + E2[uVar6] * this->m_S[uVar9][uVar6];
          }
          dVar13 = 0.0;
          if (!bVar2) {
            dVar13 = ABS((E1[uVar9] * dVar11 + local_e8) / dVar12);
          }
          rc = TestMatrixReturnValue(dVar13,rc);
          if ((rc < 0.0) ||
             ((uVar5 == 2 &&
              (rc = TestMatrixReturnValue(ABS((E2[uVar9] * dVar11 + dStack_e0) / dVar14),rc),
              rc < 0.0)))) break;
          if (bVar1) {
            if ((this->m_LP != (double *)0x0) &&
               ((dVar13 = this->m_LP[uVar9], dVar13 != LP[uVar9] || (NAN(dVar13) || NAN(LP[uVar9])))
               )) {
              ON_SubDIncrementErrorCount();
              goto LAB_00622770;
            }
            local_e8 = 0.0;
            dStack_e0 = 0.0;
            for (uVar6 = 0; this->m_R != uVar6; uVar6 = uVar6 + 1) {
              local_e8 = local_e8 + L1[uVar6] * this->m_S[uVar6][uVar9];
              dStack_e0 = dStack_e0 + L2[uVar6] * this->m_S[uVar6][uVar9];
            }
            if (bVar3) {
              dVar13 = 0.0;
              if (((int)uVar9 != 2) && ((int)uVar9 != 4)) goto LAB_0062266a;
            }
            else {
LAB_0062266a:
              dVar13 = ABS((L1[uVar9] * dVar11 + local_e8) / dVar15);
            }
            rc = TestMatrixReturnValue(dVar13,rc);
            if ((rc < 0.0) ||
               ((uVar5 == 2 &&
                (rc = TestMatrixReturnValue(ABS((L2[uVar9] * dVar11 + dStack_e0) / dVar16),rc),
                rc < 0.0)))) break;
            local_58 = local_58 + L1[uVar9];
            local_68 = local_68 + L2[uVar9];
            dVar13 = LP[uVar9];
            local_88 = local_88 + dVar13;
            local_98 = local_98 + dVar13 * E1[uVar9];
            dStack_90 = dStack_90 + dVar13 * E2[uVar9];
          }
        }
        local_e8 = rc;
        if (bVar1) {
          if (0.0 <= rc) {
            local_e8 = TestMatrixReturnValue(ABS(1.0 - local_88),rc);
            dVar11 = 0.0;
            if (((0.0 <= local_e8) &&
                (((bVar2 || (dVar11 = TestMatrixReturnValue(ABS(local_98) / dVar12,local_e8),
                            local_e8 = dVar11, 0.0 <= dVar11)) &&
                 (local_e8 = TestMatrixReturnValue(ABS(dStack_90) / dVar14,dVar11), 0.0 <= local_e8)
                 ))) && (local_e8 = TestMatrixReturnValue(ABS(local_58) / dVar15,local_e8),
                        0.0 <= local_e8)) {
              local_e8 = TestMatrixReturnValue(ABS(local_68) / dVar16,local_e8);
            }
          }
          dVar11 = ON_SubDSectorType::SurfaceNormalSign(&this->m_sector_type);
          if (dVar11 <= 0.0) {
            ON_SubDIncrementErrorCount();
            goto LAB_00622770;
          }
        }
        if (0.0 <= local_e8) goto LAB_00622778;
        ON_SubDIncrementErrorCount();
        goto LAB_00622770;
      }
    }
    ON_SubDIncrementErrorCount();
  }
LAB_00622770:
  local_e8 = -1.23432101234321e+308;
LAB_00622778:
  ON_SimpleArray<double>::~ON_SimpleArray(&local_48);
  return local_e8;
}

Assistant:

double ON_SubDMatrix::TestMatrix() const
{
  if (nullptr == m_S || m_R < 3)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if ( false == m_sector_type.IsValid() )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (m_R != m_sector_type.PointRingCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const double lambda = m_sector_type.SubdominantEigenvalue();
  if (!(lambda > 0.0 && lambda < 1.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int lambda_multiplicity = m_sector_type.SubdominantEigenvalueMulitiplicity();
  if ( lambda_multiplicity <= 0 )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  double rc = 0.0;


  const bool bTestLimitEvaluation = m_sector_type.SurfaceEvaluationCoefficientsAvailable();

  // Eigen information test
  ON_SimpleArray<double> buffer;
  double* E1 = buffer.Reserve(5*m_R);
  double* E2 = E1 + m_R;
  double* LP = E2 + m_R;
  double* L1 = LP + m_R;
  double* L2 = L1 + m_R;
  double d = m_sector_type.GetSubdominantEigenvectors(E1, m_R, E2, m_R);
  if (!(d == lambda))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (bTestLimitEvaluation)
  {
    if (!m_sector_type.GetSurfaceEvaluationCoefficients(LP, m_R, L1, m_R, L2, m_R))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  }
  else
  {
    for (unsigned int i = 0; i < m_R; i++)
    {
      LP[i] = 0.0;
      L1[i] = 0.0;
      L2[i] = 0.0;
    }
  }

  // A smooth sector with 2 faces is degenerate and does not have nice eigenvalues and eigenvectors
  // that give a well defined surface normal. In this case we use a heuristic for the normal.
  // When bSmoothTwoFaceCase E1 = {0,0,0,0,0}, lengthE1 = 0, lengthE1 = 0.
  const bool bSmoothTwoFaceCase
    = (m_sector_type.IsSmoothSector() || m_sector_type.IsDartSector())
    && 2u == m_sector_type.FaceCount()
    && 2u == m_sector_type.EdgeCount()
    ;
  const bool bDartTwoFaceCase
    = (m_sector_type.IsSmoothSector() || m_sector_type.IsDartSector())
    && 2u == m_sector_type.FaceCount()
    && 2u == m_sector_type.EdgeCount()
    ;
  const bool bSmoothOrDartTwoFaceCase = bSmoothTwoFaceCase || bDartTwoFaceCase;

  double lengthE1 = 0.0;
  double lengthE2 = 0.0;
  double lengthL1 = 0.0;
  double lengthL2 = 0.0;
  for (unsigned int i = 0; i < m_R; i++)
  {
    lengthE1 += E1[i] * E1[i];
    lengthE2 += E2[i] * E2[i];
    lengthL1 += L1[i] * L1[i];
    lengthL2 += L2[i] * L2[i];
  }
  if (false == bSmoothOrDartTwoFaceCase && !(lengthE1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthE2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  lengthE1 = sqrt(lengthE1);
  lengthE2 = sqrt(lengthE2);
  lengthL1 = sqrt(lengthL1);
  lengthL2 = sqrt(lengthL2);
  if (false == bSmoothOrDartTwoFaceCase && !(lengthE1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthE2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  double LPsum = 0.0;
  double L1sum = 0.0;
  double L2sum = 0.0;
  double E1oLP = 0.0;
  double E2oLP = 0.0;
  for (unsigned int i = 0; i < m_R; i++)
  {
    if (!(LP[i] >= 0.0))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

    const double* Si = m_S[i];
    double x1 = 0.0;
    double x2 = 0.0;
    for (unsigned int j = 0; j < m_R; j++)
    {
      // E1, E2 should be eigenvectors of S with eigenvalue lambda
      x1 += Si[j] * E1[j];
      x2 += Si[j] * E2[j];
    }
    d = bSmoothOrDartTwoFaceCase ? 0.0 : fabs((x1 - lambda*E1[i])/lengthE1);
    rc = TestMatrixReturnValue(d,rc);
    if (!(rc >= 0.0))
      break;

    if (2 == lambda_multiplicity)
    {
      d = fabs((x2 - lambda*E2[i])/lengthE2);
      rc = TestMatrixReturnValue(d, rc);
      if (!(rc >= 0.0))
        break;
    }

    if ( false == bTestLimitEvaluation )
      continue;

    if (nullptr != m_LP)
    {
      if ( !(m_LP[i] == LP[i]) )
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
    }

    double y1 = 0.0;
    double y2 = 0.0;
    for (unsigned int j = 0; j < m_R; j++)
    {
      // L1, L2 should be eigenvectors of Transpose(S) with eigenvalue lambda
      y1 += m_S[j][i] * L1[j];
      y2 += m_S[j][i] * L2[j];
    }

    d = (bDartTwoFaceCase && (2u == i || 4u == i)) ? 0.0 : fabs((y1 - lambda*L1[i])/lengthL1);
    rc = TestMatrixReturnValue(d,rc);
    if (!(rc >= 0.0))
      break;

    if (2 == lambda_multiplicity)
    {
      d = fabs((y2 - lambda*L2[i])/lengthL2);
      rc = TestMatrixReturnValue(d, rc);
      if (!(rc >= 0.0))
        break;
    }


    LPsum += LP[i];
    L1sum += L1[i];
    L2sum += L2[i];

    E1oLP += E1[i] * LP[i];
    E2oLP += E2[i] * LP[i];
  }
    
  if (bTestLimitEvaluation)
  {
    while (rc >= 0.0)
    {
      // LP coefficients should sum to 1
      rc = TestMatrixReturnValue(fabs(1.0 - LPsum), rc);
      if (!(rc >= 0.0))
        break;

      // E1 and E2 should be orthogonal to LP which means
      // E0oLP and E1oLP should be zero
      //
      // Why?
      //   Set T = Transpose(S).
      //   T*LP = LP (LP is an eigenvector or T with eigenvalue = 1)
      //   S*E = lambda*E (E is an eigenvector of S with eigenvalue lambda != 1)
      //   LP o E1
      //    = Transpose(LP) * E
      //    = Transpose( T*LP ) * E
      //    = Transpose(LP) * Transpose(T) * E
      //    = Transpose(LP) * S * E
      //    = Transpose(LP) * (lambda E)
      //    = lambda * (Transpose(LP) * E )
      //    = lambda * LPoE
      //   If LPoE != 0, then lambda = 1, which is not the case.
      rc = bSmoothOrDartTwoFaceCase ? 0.0 : TestMatrixReturnValue(fabs(E1oLP) / lengthE1, rc);
      if (!(rc >= 0.0))
        break;
      rc = TestMatrixReturnValue(fabs(E2oLP) / lengthE2, rc);
      if (!(rc >= 0.0))
        break;

      // L1 and L2 should be orthogonal to (1,1,...,1) which means
      // L1 L2 coefficients should sum to zero.
      rc = TestMatrixReturnValue(fabs(L1sum) / lengthL1, rc);
      if (!(rc >= 0.0))
        break;
      rc = TestMatrixReturnValue(fabs(L2sum) / lengthL2, rc);
      if (!(rc >= 0.0))
        break;

      break;
    }

    // See if L1 and L2 can produce a reasonable normal in the simplest possible case
    double z = m_sector_type.SurfaceNormalSign();
    if (!(z > 0.0))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  }

  if (rc >= 0.0)
    return rc;

  return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE); 
}